

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_color.hpp
# Opt level: O2

void __thiscall
optimization::graph_color::Conflict_Map::remove_edge_larger_colors(Conflict_Map *this)

{
  uint32_t uVar1;
  int iVar2;
  _Rb_tree_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  uint32_t uVar5;
  int iVar6;
  VarId local_50;
  VarId local_40;
  
  if ((this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    iVar6 = 9999999;
    p_Var4 = (this->edge_vars)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_40.id = 0xffffffff;
    while ((_Rb_tree_header *)p_Var4 != &(this->edge_vars)._M_t._M_impl.super__Rb_tree_header) {
      uVar5 = local_40.id;
      for (p_Var3 = *(_Rb_tree_node_base **)(p_Var4 + 2);
          p_Var3 != (_Rb_tree_node_base *)&p_Var4[1]._M_left;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        uVar1 = *(uint32_t *)&p_Var3[1]._M_parent;
        local_50.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        local_50.id = uVar1;
        iVar2 = get_priority(this,&local_50);
        if (iVar2 < iVar6) {
          iVar6 = iVar2;
          uVar5 = uVar1;
        }
      }
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      local_40.id = uVar5;
    }
    local_40.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
    remove_node(this,&local_40,false);
  }
  return;
}

Assistant:

void remove_edge_larger_colors() {
    if (!edge_vars.size()) {
      return;
    }
    int priority = 9999999;
    // mir::inst::VarId var;
    // for (auto& pair : dynamic_Map) {
    //   if (get_priority(pair.first) < priority) {
    //     var = pair.first;
    //   }
    // }
    mir::inst::VarId var;
    for (auto& edgepair : edge_vars) {
      for (auto var1 : edgepair.second) {
        auto pri1 = get_priority(var1);
        if (pri1 < priority) {
          priority = pri1;
          var = var1;
        }
      }
    }
    remove_node(var, false);
  }